

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinsol.c
# Opt level: O0

void KINPrintInfo(KINMem kin_mem,int info_code,char *module,char *fname,char *msgfmt,...)

{
  uint local_230;
  char local_198 [4];
  int ret;
  char retstr [30];
  char msg1 [40];
  char local_148 [8];
  char msg [256];
  va_list ap;
  char *msgfmt_local;
  char *fname_local;
  char *module_local;
  int info_code_local;
  KINMem kin_mem_local;
  
  msg[0xfc] = '0';
  msg[0xfd] = '\0';
  msg[0xfe] = '\0';
  msg[0xff] = '\0';
  msg[0xf8] = '(';
  msg[0xf9] = '\0';
  msg[0xfa] = '\0';
  msg[0xfb] = '\0';
  if (info_code == 1) {
    msg[0xfc] = '0';
    msg[0xfd] = '\0';
    msg[0xfe] = '\0';
    msg[0xff] = '\0';
    msg[0xf8] = '0';
    msg[0xf9] = '\0';
    msg[0xfa] = '\0';
    msg[0xfb] = '\0';
    switch(local_230) {
    case 0:
      sprintf(local_198,"KIN_SUCCESS");
      break;
    case 2:
      sprintf(local_198,"KIN_STEP_LT_STPTOL");
      break;
    case 0xfffffff1:
      sprintf(local_198,"KIN_REPTD_SYSFUNC_ERR");
      break;
    case 0xfffffff3:
      sprintf(local_198,"KIN_SYSFUNC_FAIL");
      break;
    case 0xfffffff4:
      sprintf(local_198,"KIN_PRECONDSOLVE_FAILURE");
      break;
    case 0xfffffff5:
      sprintf(local_198,"KIN_PRECONDSET_FAILURE");
      break;
    case 0xfffffff7:
      sprintf(local_198,"KIN_LINSOLV_NO_RECOVERY");
      break;
    case 0xfffffff8:
      sprintf(local_198,"KIN_LINESEARCH_BCFAIL");
      break;
    case 0xfffffff9:
      sprintf(local_198,"KIN_MXNEWT_5X_EXCEEDED");
      break;
    case 0xfffffffa:
      sprintf(local_198,"KIN_MAXITER_REACHED");
      break;
    case 0xfffffffb:
      sprintf(local_198,"KIN_LINESEARCH_NONCONV");
    }
    sprintf(retstr + 0x18,msgfmt,(ulong)local_230);
    sprintf(local_148,"%s (%s)",retstr + 0x18,local_198);
  }
  else {
    vsprintf(local_148,msgfmt,msg + 0xf8);
  }
  (*kin_mem->kin_ihfun)(module,fname,local_148,kin_mem->kin_ih_data);
  return;
}

Assistant:

void KINPrintInfo(KINMem kin_mem, 
                  int info_code, const char *module, const char *fname, 
                  const char *msgfmt, ...)
{
  va_list ap;
  char msg[256], msg1[40];
  char retstr[30];
  int ret;

  /* Initialize argument processing 
   (msgfrmt is the last required argument) */

  va_start(ap, msgfmt); 

  if (info_code == PRNT_RETVAL) {

    /* If info_code = PRNT_RETVAL, decode the numeric value */

    ret = va_arg(ap, int);

    switch(ret) {
    case KIN_SUCCESS:
      sprintf(retstr, "KIN_SUCCESS");
      break;
    case KIN_SYSFUNC_FAIL:
      sprintf(retstr, "KIN_SYSFUNC_FAIL");
      break;
    case KIN_REPTD_SYSFUNC_ERR:
      sprintf(retstr, "KIN_REPTD_SYSFUNC_ERR");
      break;
    case KIN_STEP_LT_STPTOL:
      sprintf(retstr, "KIN_STEP_LT_STPTOL");
      break;
    case KIN_LINESEARCH_NONCONV:
      sprintf(retstr, "KIN_LINESEARCH_NONCONV");
      break;
    case KIN_LINESEARCH_BCFAIL:
      sprintf(retstr, "KIN_LINESEARCH_BCFAIL");
      break;
    case KIN_MAXITER_REACHED:
      sprintf(retstr, "KIN_MAXITER_REACHED");
      break;
    case KIN_MXNEWT_5X_EXCEEDED:
      sprintf(retstr, "KIN_MXNEWT_5X_EXCEEDED");
      break;
    case KIN_LINSOLV_NO_RECOVERY:
      sprintf(retstr, "KIN_LINSOLV_NO_RECOVERY");
      break;
    case KIN_LSETUP_FAIL:
      sprintf(retstr, "KIN_PRECONDSET_FAILURE");
      break;
    case KIN_LSOLVE_FAIL:
      sprintf(retstr, "KIN_PRECONDSOLVE_FAILURE");
      break;
    }

    /* Compose the message */

    sprintf(msg1, msgfmt, ret);
    sprintf(msg,"%s (%s)",msg1,retstr);


  } else {
  
    /* Compose the message */

    vsprintf(msg, msgfmt, ap);

  }

  /* call the info message handler */

  ihfun(module, fname, msg, ih_data);

  /* finalize argument processing */

  va_end(ap);

  return;
}